

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void __thiscall ELLIPSOID::ELLIPSOID(ELLIPSOID *this)

{
  ELLIPSOID *this_local;
  
  this->a = 6378137.0;
  this->b = 6356752.3141;
  this->c = (this->a * this->a) / this->b;
  this->alpha = (this->a - this->b) / this->a;
  this->e2 = (this->a * this->a + -(this->b * this->b)) / (this->a * this->a);
  this->e1_2 = (this->a * this->a + -(this->b * this->b)) / (this->b * this->b);
  this->gama_a = 9.7803267715;
  this->gama_b = 9.8321863685;
  return;
}

Assistant:

ELLIPSOID::ELLIPSOID()
{
    this->a = a_c;
    this->b = b_c;
    this->c = this->a * this->a / this->b;
    this->alpha = (this->a - this->b) / this->a;
    this->e2 = (this->a * this->a - this->b * this->b) / (this->a * this->a);
    this->e1_2 = (this->a * this->a - this->b * this->b) / (this->b * this->b);
    this->gama_a = gama_a_grs;
    this->gama_b = gama_b_grs;
}